

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# run.c
# Opt level: O1

void run_container_grow(run_container_t *run,int32_t min,_Bool copy)

{
  uint uVar1;
  int iVar2;
  rle16_t *prVar3;
  rle16_t *prVar4;
  uint uVar5;
  
  uVar1 = run->capacity;
  if (uVar1 == 0) {
    iVar2 = 0;
  }
  else if ((int)uVar1 < 0x40) {
    iVar2 = uVar1 * 2;
  }
  else {
    if ((int)uVar1 < 0x400) {
      uVar5 = uVar1 >> 1;
    }
    else {
      uVar5 = uVar1 >> 2;
    }
    iVar2 = uVar1 + uVar5;
  }
  if (min < iVar2) {
    min = iVar2;
  }
  run->capacity = min;
  prVar4 = run->runs;
  if (copy) {
    prVar3 = (rle16_t *)roaring_realloc(prVar4,(long)min << 2);
    run->runs = prVar3;
    if (prVar3 == (rle16_t *)0x0) {
      roaring_free(prVar4);
      return;
    }
  }
  else {
    roaring_free(prVar4);
    prVar4 = (rle16_t *)roaring_malloc((long)run->capacity << 2);
    run->runs = prVar4;
  }
  return;
}

Assistant:

void run_container_grow(run_container_t *run, int32_t min, bool copy) {
    int32_t newCapacity = (run->capacity == 0)   ? RUN_DEFAULT_INIT_SIZE
                          : run->capacity < 64   ? run->capacity * 2
                          : run->capacity < 1024 ? run->capacity * 3 / 2
                                                 : run->capacity * 5 / 4;
    if (newCapacity < min) newCapacity = min;
    run->capacity = newCapacity;
    assert(run->capacity >= min);
    if (copy) {
        rle16_t *oldruns = run->runs;
        run->runs = (rle16_t *)roaring_realloc(oldruns,
                                               run->capacity * sizeof(rle16_t));
        if (run->runs == NULL) roaring_free(oldruns);
    } else {
        roaring_free(run->runs);
        run->runs = (rle16_t *)roaring_malloc(run->capacity * sizeof(rle16_t));
    }
    // We may have run->runs == NULL.
}